

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O0

void deqp::RobustBufferAccessBehavior::Shader::Compile(Functions *gl,GLuint id)

{
  glGetShaderInfoLogFunc p_Var1;
  undefined4 uVar2;
  GLint GVar3;
  GLenum GVar4;
  GLchar *pGVar5;
  TestError *this;
  char *message_00;
  string local_40 [8];
  string message;
  GLint local_18;
  GLint length;
  GLint status;
  GLuint id_local;
  Functions *gl_local;
  
  local_18 = 0;
  length = id;
  _status = gl;
  (*gl->compileShader)(id);
  GVar4 = (*_status->getError)();
  glu::checkError(GVar4,"CompileShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x224);
  (*_status->getShaderiv)(length,0x8b81,&local_18);
  GVar4 = (*_status->getError)();
  glu::checkError(GVar4,"GetShaderiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x228);
  if (local_18 != 1) {
    message.field_2._12_4_ = 0;
    std::__cxx11::string::string(local_40);
    (*_status->getShaderiv)(length,0x8b84,(GLint *)(message.field_2._M_local_buf + 0xc));
    GVar4 = (*_status->getError)();
    glu::checkError(GVar4,"GetShaderiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x232);
    std::__cxx11::string::resize((ulong)local_40,(char)message.field_2._12_4_);
    GVar3 = length;
    uVar2 = message.field_2._12_4_;
    p_Var1 = _status->getShaderInfoLog;
    pGVar5 = (GLchar *)std::__cxx11::string::operator[]((ulong)local_40);
    (*p_Var1)(GVar3,uVar2,(GLsizei *)0x0,pGVar5);
    GVar4 = (*_status->getError)();
    glu::checkError(GVar4,"GetShaderInfoLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x239);
    this = (TestError *)__cxa_allocate_exception(0x38);
    message_00 = (char *)std::__cxx11::string::c_str();
    tcu::TestError::TestError
              (this,message_00,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
               ,0x23b);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void Shader::Compile(const glw::Functions& gl, glw::GLuint id)
{
	GLint status = GL_FALSE;

	/* Compile */
	gl.compileShader(id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "CompileShader");

	/* Get compilation status */
	gl.getShaderiv(id, GL_COMPILE_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

	/* Log compilation error */
	if (GL_TRUE != status)
	{
		glw::GLint  length = 0;
		std::string message;

		/* Error log length */
		gl.getShaderiv(id, GL_INFO_LOG_LENGTH, &length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

		/* Prepare storage */
		message.resize(length, 0);

		/* Get error log */
		gl.getShaderInfoLog(id, length, 0, &message[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderInfoLog");

		TCU_FAIL(message.c_str());
	}
}